

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void duckdb_fastpforlib::internal::Unroller<(unsigned_short)24,_(unsigned_short)24>::Pack
               (uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = in[0x19];
  *out = uVar1 << 0x18 | in[0x18] & 0xffffff;
  uVar2 = in[0x1a];
  out[1] = uVar2 << 0x10 | uVar1 >> 8 & 0xffff;
  out[2] = uVar2 >> 0x10 & 0xff;
  Unroller<(unsigned_short)24,_(unsigned_short)27>::Pack(in,out + 2);
  return;
}

Assistant:

static void Pack(const uint32_t *__restrict in, uint32_t *__restrict out) {
		pack_single_in<uint32_t, DELTA, (DELTA * OINDEX) % 32, (1U << DELTA) - 1>(in[OINDEX], out);

		Unroller<DELTA, OINDEX + 1>::Pack(in, out);
	}